

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int isAsteriskTerm(Parse *pParse,Expr *pTerm)

{
  char *in_RSI;
  Parse *in_RDI;
  int local_4;
  
  if (*in_RSI == -0x4c) {
    local_4 = 1;
  }
  else if (*in_RSI == -0x72) {
    if (**(char **)(in_RSI + 0x18) == -0x4c) {
      sqlite3ErrorMsg(in_RDI,"RETURNING may not use \"TABLE.*\" wildcards");
      local_4 = 1;
    }
    else {
      local_4 = 0;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int isAsteriskTerm(
  Parse *pParse,      /* Parsing context */
  Expr *pTerm         /* A term in the RETURNING clause */
){
  assert( pTerm!=0 );
  if( pTerm->op==TK_ASTERISK ) return 1;
  if( pTerm->op!=TK_DOT ) return 0;
  assert( pTerm->pRight!=0 );
  assert( pTerm->pLeft!=0 );
  if( pTerm->pRight->op!=TK_ASTERISK ) return 0;
  sqlite3ErrorMsg(pParse, "RETURNING may not use \"TABLE.*\" wildcards");
  return 1;
}